

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_call_function(Nvim *this,string *fn,Array *args)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"nvim_call_function",&local_41);
  NvimRPC::
  async_call<std::__cxx11::string,std::vector<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::allocator<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>
            (&this->client_,&local_40,fn,args);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Nvim::async_call_function(const std::string& fn, const Array& args) {
    client_.async_call("nvim_call_function", fn, args);
}